

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

bool util::is_valid_player_name(char *str,size_t len,bool allow_empty)

{
  int iVar1;
  ulong local_38;
  size_t i;
  size_t max_name_len;
  bool allow_empty_local;
  size_t len_local;
  char *str_local;
  
  if (len < 0x41) {
    if ((allow_empty) || ((str != (char *)0x0 && (*str != '0')))) {
      for (local_38 = 0; local_38 < len; local_38 = local_38 + 1) {
        if ((str[local_38] == ' ') || (iVar1 = isprint((int)str[local_38]), iVar1 == 0)) {
          return false;
        }
      }
      str_local._7_1_ = true;
    }
    else {
      str_local._7_1_ = false;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool is_valid_player_name(const char* str, size_t len, bool allow_empty/* = true*/)
{
	constexpr size_t max_name_len = 64;
	if (len > max_name_len)
		return false;

	if (!allow_empty && (str == nullptr || *str == '0'))
		return false;

	for (size_t i = 0; i < len; ++i)
		if (str[i] == ' ' || !isprint(str[i]))
			return false;

	return true;
}